

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3c8e00::CFLSubAvgTest_DISABLED_SubAvgSpeedTest_Test::TestBody
          (CFLSubAvgTest_DISABLED_SubAvgSpeedTest_Test *this)

{
  ushort uVar1;
  uint32_t uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  aom_usec_timer timer;
  aom_usec_timer ref_timer;
  int16_t dst_ref [1024];
  int16_t dst [1024];
  int in_stack_ffffffffffffef88;
  int in_stack_ffffffffffffef8c;
  long local_1070;
  timeval local_1068;
  timeval local_1058;
  timeval local_1048;
  int16_t local_1038 [1024];
  int16_t local_838 [1028];
  
  iVar4 = (this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.super_CFLTest.height;
  if (0 < iVar4) {
    uVar3 = (ulong)(uint)(this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.
                         super_CFLTest.width;
    lVar6 = 0;
    do {
      if (0 < (int)uVar3) {
        uVar7 = (ulong)((uint)lVar6 & 0x7ffffff);
        lVar5 = 0;
        do {
          uVar2 = testing::internal::Random::Generate
                            (&(this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.
                              super_CFLTest.rnd.random_,0x80000000);
          uVar1 = (ushort)(uVar2 >> 0x10) & 0x7fff;
          (this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.data
          [uVar7 * 0x20 + lVar5] = uVar1;
          (this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.data_ref
          [uVar7 * 0x20 + lVar5] = uVar1;
          lVar5 = lVar5 + 1;
          uVar3 = (ulong)(this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.
                         super_CFLTest.width;
        } while (lVar5 < (long)uVar3);
        iVar4 = (this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.super_CFLTest.
                height;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  gettimeofday(&local_1058,(__timezone_ptr_t)0x0);
  iVar4 = 0x7fff;
  do {
    (*(this->super_CFLSubAvgTest).sub_avg_ref)
              ((this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.data_ref,local_1038
              );
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  gettimeofday(&local_1048,(__timezone_ptr_t)0x0);
  gettimeofday((timeval *)&stack0xffffffffffffef88,(__timezone_ptr_t)0x0);
  iVar4 = 0x7fff;
  do {
    (*(this->super_CFLSubAvgTest).sub_avg)
              ((this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.data,local_838);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  lVar6 = local_1048.tv_usec - local_1058.tv_usec;
  iVar4 = (int)lVar6 + 1000000;
  if (-1 < lVar6) {
    iVar4 = (int)lVar6;
  }
  gettimeofday(&local_1068,(__timezone_ptr_t)0x0);
  lVar5 = local_1068.tv_usec - local_1070;
  iVar8 = (int)lVar5 + 1000000;
  if (-1 < lVar5) {
    iVar8 = (int)lVar5;
  }
  printSpeed(iVar4 + ((int)(lVar6 >> 0x3f) + ((int)local_1048.tv_sec - (int)local_1058.tv_sec)) *
                     1000000,
             iVar8 + ((int)(lVar5 >> 0x3f) + ((int)local_1068.tv_sec - in_stack_ffffffffffffef88)) *
                     1000000,
             (this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.super_CFLTest.width,
             (this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.super_CFLTest.height)
  ;
  assertFaster(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88);
  return;
}

Assistant:

TEST_P(CFLSubAvgTest, DISABLED_SubAvgSpeedTest) {
  int16_t dst[CFL_BUF_SQUARE];
  int16_t dst_ref[CFL_BUF_SQUARE];
  aom_usec_timer ref_timer;
  aom_usec_timer timer;
  randData(&ACMRandom::Rand15);
  aom_usec_timer_start(&ref_timer);
  for (int k = 0; k < NUM_ITERATIONS_SPEED; k++) {
    sub_avg_ref(data_ref, dst_ref);
  }
  aom_usec_timer_mark(&ref_timer);
  int ref_elapsed_time = (int)aom_usec_timer_elapsed(&ref_timer);
  aom_usec_timer_start(&timer);
  for (int k = 0; k < NUM_ITERATIONS_SPEED; k++) {
    sub_avg(data, dst);
  }
  aom_usec_timer_mark(&timer);
  int elapsed_time = (int)aom_usec_timer_elapsed(&timer);
  printSpeed(ref_elapsed_time, elapsed_time, width, height);
  assertFaster(ref_elapsed_time, elapsed_time);
}